

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::createDrawData
          (ComputeShaderGeneratedCase *this)

{
  code *pcVar1;
  float *pfVar2;
  int iVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar5;
  size_type sVar6;
  float *pfVar7;
  float fVar8;
  float *local_150;
  Vector<float,_4> local_12c;
  Vector<float,_4> local_11c;
  float local_10c;
  float local_108;
  float posY_1;
  float posX_1;
  int x_1;
  int y_1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer_1;
  undefined8 local_d8;
  Vector<float,_4> local_d0;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  Vector<float,_4> local_a0;
  Vector<float,_4> local_90;
  float *local_80;
  Vec4 *color;
  float cellSize;
  float posY;
  float posX;
  int x;
  int y;
  allocator<tcu::Vector<float,_4>_> local_51;
  undefined1 local_50 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer;
  Functions *gl;
  Vec4 green;
  Vec4 yellow;
  ComputeShaderGeneratedCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gl,0.0,1.0,0.0,1.0);
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
    iVar3 = this->m_gridSize;
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_51);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_50,
               (long)(iVar3 * iVar3 * 0xc),&local_51);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_51);
    for (posX = 0.0; (int)posX < this->m_gridSize; posX = (float)((int)posX + 1)) {
      for (posY = 0.0; (int)posY < this->m_gridSize; posY = (float)((int)posY + 1)) {
        fVar8 = (float)(int)posY / (float)this->m_gridSize;
        cellSize = fVar8 + fVar8 + -1.0;
        fVar8 = (float)(int)posX / (float)this->m_gridSize;
        color._4_4_ = fVar8 + fVar8 + -1.0;
        color._0_4_ = 2.0 / (float)this->m_gridSize;
        if (((int)posY + (int)posX) % 2 == 0) {
          local_150 = (float *)&gl;
        }
        else {
          local_150 = green.m_data + 2;
        }
        local_80 = local_150;
        tcu::Vector<float,_4>::Vector(&local_90,cellSize,color._4_4_,0.0,1.0);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,(long)(((int)posX * this->m_gridSize + (int)posY) * 0xc));
        *(undefined8 *)pvVar5->m_data = local_90.m_data._0_8_;
        *(undefined8 *)(pvVar5->m_data + 2) = local_90.m_data._8_8_;
        tcu::Vector<float,_4>::Vector(&local_a0,cellSize + color._0_4_,color._4_4_,0.0,1.0);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,(long)(((int)posX * this->m_gridSize + (int)posY) * 0xc + 2)
                           );
        *(undefined8 *)pvVar5->m_data = local_a0.m_data._0_8_;
        *(undefined8 *)(pvVar5->m_data + 2) = local_a0.m_data._8_8_;
        tcu::Vector<float,_4>::Vector
                  (&local_b0,cellSize + color._0_4_,color._4_4_ + color._0_4_,0.0,1.0);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,(long)(((int)posX * this->m_gridSize + (int)posY) * 0xc + 4)
                           );
        *(undefined8 *)pvVar5->m_data = local_b0.m_data._0_8_;
        *(undefined8 *)(pvVar5->m_data + 2) = local_b0.m_data._8_8_;
        tcu::Vector<float,_4>::Vector(&local_c0,cellSize,color._4_4_,0.0,1.0);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,(long)(((int)posX * this->m_gridSize + (int)posY) * 0xc + 6)
                           );
        *(undefined8 *)pvVar5->m_data = local_c0.m_data._0_8_;
        *(undefined8 *)(pvVar5->m_data + 2) = local_c0.m_data._8_8_;
        tcu::Vector<float,_4>::Vector
                  (&local_d0,cellSize + color._0_4_,color._4_4_ + color._0_4_,0.0,1.0);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,(long)(((int)posX * this->m_gridSize + (int)posY) * 0xc + 8)
                           );
        *(undefined8 *)pvVar5->m_data = local_d0.m_data._0_8_;
        *(undefined8 *)(pvVar5->m_data + 2) = local_d0.m_data._8_8_;
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)
                   &buffer_1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,cellSize,
                   color._4_4_ + color._0_4_,0.0,1.0);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,
                            (long)((((int)posX * this->m_gridSize + (int)posY) * 6 + 5) * 2));
        pfVar7 = local_80;
        *(pointer *)pvVar5->m_data =
             buffer_1.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        *(undefined8 *)(pvVar5->m_data + 2) = local_d8;
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,(long)(((int)posX * this->m_gridSize + (int)posY) * 0xc + 1)
                           );
        pfVar2 = local_80;
        *(undefined8 *)pvVar5->m_data = *(undefined8 *)pfVar7;
        *(undefined8 *)(pvVar5->m_data + 2) = *(undefined8 *)(pfVar7 + 2);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,
                            (long)((((int)posX * this->m_gridSize + (int)posY) * 6 + 1) * 2 + 1));
        pfVar7 = local_80;
        *(undefined8 *)pvVar5->m_data = *(undefined8 *)pfVar2;
        *(undefined8 *)(pvVar5->m_data + 2) = *(undefined8 *)(pfVar2 + 2);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,
                            (long)((((int)posX * this->m_gridSize + (int)posY) * 6 + 2) * 2 + 1));
        pfVar2 = local_80;
        *(undefined8 *)pvVar5->m_data = *(undefined8 *)pfVar7;
        *(undefined8 *)(pvVar5->m_data + 2) = *(undefined8 *)(pfVar7 + 2);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,
                            (long)((((int)posX * this->m_gridSize + (int)posY) * 6 + 3) * 2 + 1));
        pfVar7 = local_80;
        *(undefined8 *)pvVar5->m_data = *(undefined8 *)pfVar2;
        *(undefined8 *)(pvVar5->m_data + 2) = *(undefined8 *)(pfVar2 + 2);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,
                            (long)((((int)posX * this->m_gridSize + (int)posY) * 6 + 4) * 2 + 1));
        pfVar2 = local_80;
        *(undefined8 *)pvVar5->m_data = *(undefined8 *)pfVar7;
        *(undefined8 *)(pvVar5->m_data + 2) = *(undefined8 *)(pfVar7 + 2);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_50,
                            (long)((((int)posX * this->m_gridSize + (int)posY) * 6 + 5) * 2 + 1));
        *(undefined8 *)pvVar5->m_data = *(undefined8 *)pfVar2;
        *(undefined8 *)(pvVar5->m_data + 2) = *(undefined8 *)(pfVar2 + 2);
      }
    }
    (**(code **)buffer.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage[4].m_data)
              (0x8892,this->m_dataBufferID);
    pcVar1 = *(code **)buffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[0x15].m_data;
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_50);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_50,0);
    pfVar7 = tcu::Vector<float,_4>::getPtr(pvVar5);
    (*pcVar1)(0x8892,(long)((int)sVar6 << 4),pfVar7,0x88e4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_50);
  }
  else if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    iVar3 = this->m_gridSize + 1;
    std::allocator<tcu::Vector<float,_4>_>::allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&x_1 + 3));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y_1,
               (long)(iVar3 * iVar3 * 4),(allocator<tcu::Vector<float,_4>_> *)((long)&x_1 + 3));
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&x_1 + 3));
    for (posX_1 = 0.0; (int)posX_1 < this->m_gridSize + 1; posX_1 = (float)((int)posX_1 + 1)) {
      for (posY_1 = 0.0; (int)posY_1 < this->m_gridSize + 1; posY_1 = (float)((int)posY_1 + 1)) {
        fVar8 = (float)(int)posY_1 / (float)this->m_gridSize;
        local_108 = fVar8 + fVar8 + -1.0;
        fVar8 = (float)(int)posX_1 / (float)this->m_gridSize;
        local_10c = fVar8 + fVar8 + -1.0;
        tcu::Vector<float,_4>::Vector(&local_11c,local_108,local_10c,0.0,1.0);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&y_1,(long)(((int)posX_1 * (this->m_gridSize + 1) + (int)posY_1) * 4)
                           );
        *(undefined8 *)pvVar5->m_data = local_11c.m_data._0_8_;
        *(undefined8 *)(pvVar5->m_data + 2) = local_11c.m_data._8_8_;
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&y_1,(long)(((int)posX_1 * (this->m_gridSize + 1) + (int)posY_1) * 4
                                          + 1));
        *(Functions **)pvVar5->m_data = gl;
        *(undefined8 *)(pvVar5->m_data + 2) = green.m_data._0_8_;
        tcu::Vector<float,_4>::Vector(&local_12c,local_108,local_10c,0.0,1.0);
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&y_1,(long)(((int)posX_1 * (this->m_gridSize + 1) + (int)posY_1) * 4
                                          + 2));
        *(undefined8 *)pvVar5->m_data = local_12c.m_data._0_8_;
        *(undefined8 *)(pvVar5->m_data + 2) = local_12c.m_data._8_8_;
        pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&y_1,(long)(((int)posX_1 * (this->m_gridSize + 1) + (int)posY_1) * 4
                                          + 3));
        *(undefined8 *)pvVar5->m_data = green.m_data._8_8_;
        *(undefined8 *)(pvVar5->m_data + 2) = yellow.m_data._0_8_;
      }
    }
    (**(code **)buffer.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage[4].m_data)
              (0x8892,this->m_dataBufferID);
    pcVar1 = *(code **)buffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[0x15].m_data;
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &y_1);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &y_1,0);
    pfVar7 = tcu::Vector<float,_4>::getPtr(pvVar5);
    (*pcVar1)(0x8892,(long)((int)sVar6 << 4),pfVar7,0x88e4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y_1);
  }
  err = (**(code **)buffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[0x80].m_data)();
  glu::checkError(err,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x5b6);
  return;
}

Assistant:

void ComputeShaderGeneratedCase::createDrawData (void)
{
	const tcu::Vec4			yellow	(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			green	(0.0f, 1.0f, 0.0f, 1.0f);
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();

	if (m_drawMethod == DRAWMETHOD_DRAWARRAYS)
	{
		// Store elements in the order they are drawn. Interleave color.
		std::vector<tcu::Vec4> buffer(m_gridSize*m_gridSize*6*2);

		DE_ASSERT(buffer.size() == calcDrawBufferSize());

		for (int y = 0; y < m_gridSize; ++y)
		for (int x = 0; x < m_gridSize; ++x)
		{
			const float			posX		= ((float)x / (float)m_gridSize) * 2.0f - 1.0f;
			const float			posY		= ((float)y / (float)m_gridSize) * 2.0f - 1.0f;
			const float			cellSize	= 2.0f / (float)m_gridSize;
			const tcu::Vec4&	color		= ((x + y)%2) ? (yellow) : (green);

			buffer[((y * m_gridSize + x) * 6 + 0) * 2 + 0] = tcu::Vec4(posX,			posY,				0.0f, 1.0f);
			buffer[((y * m_gridSize + x) * 6 + 1) * 2 + 0] = tcu::Vec4(posX + cellSize,	posY,				0.0f, 1.0f);
			buffer[((y * m_gridSize + x) * 6 + 2) * 2 + 0] = tcu::Vec4(posX + cellSize,	posY + cellSize,	0.0f, 1.0f);
			buffer[((y * m_gridSize + x) * 6 + 3) * 2 + 0] = tcu::Vec4(posX,			posY,				0.0f, 1.0f);
			buffer[((y * m_gridSize + x) * 6 + 4) * 2 + 0] = tcu::Vec4(posX + cellSize, posY + cellSize,	0.0f, 1.0f);
			buffer[((y * m_gridSize + x) * 6 + 5) * 2 + 0] = tcu::Vec4(posX,			posY + cellSize,	0.0f, 1.0f);

			buffer[((y * m_gridSize + x) * 6 + 0) * 2 + 1] = color;
			buffer[((y * m_gridSize + x) * 6 + 1) * 2 + 1] = color;
			buffer[((y * m_gridSize + x) * 6 + 2) * 2 + 1] = color;
			buffer[((y * m_gridSize + x) * 6 + 3) * 2 + 1] = color;
			buffer[((y * m_gridSize + x) * 6 + 4) * 2 + 1] = color;
			buffer[((y * m_gridSize + x) * 6 + 5) * 2 + 1] = color;
		}

		gl.bindBuffer(GL_ARRAY_BUFFER, m_dataBufferID);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(buffer.size() * sizeof(tcu::Vec4)), buffer[0].getPtr(), GL_STATIC_DRAW);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
	{
		// Elements are indexed by index buffer. Interleave color. Two vertices per position since 2 colors

		std::vector<tcu::Vec4> buffer((m_gridSize+1)*(m_gridSize+1)*4);

		DE_ASSERT(buffer.size() == calcDrawBufferSize());

		for (int y = 0; y < m_gridSize+1; ++y)
		for (int x = 0; x < m_gridSize+1; ++x)
		{
			const float			posX		= ((float)x / (float)m_gridSize) * 2.0f - 1.0f;
			const float			posY		= ((float)y / (float)m_gridSize) * 2.0f - 1.0f;

			buffer[(y * (m_gridSize+1) + x) * 4 + 0] = tcu::Vec4(posX, posY, 0.0f, 1.0f);
			buffer[(y * (m_gridSize+1) + x) * 4 + 1] = green;
			buffer[(y * (m_gridSize+1) + x) * 4 + 2] = tcu::Vec4(posX, posY, 0.0f, 1.0f);
			buffer[(y * (m_gridSize+1) + x) * 4 + 3] = yellow;
		}

		gl.bindBuffer(GL_ARRAY_BUFFER, m_dataBufferID);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(buffer.size() * sizeof(tcu::Vec4)), buffer[0].getPtr(), GL_STATIC_DRAW);
	}
	else
		DE_ASSERT(false);

	glu::checkError(gl.getError(), "", __FILE__, __LINE__);
}